

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O3

shared_ptr<KmerList> __thiscall
BatchKmersCounter::buildKMerCount
          (BatchKmersCounter *this,uint8_t K,LongReadsDatastore *reads,uint minCount,string *workdir
          ,string *tmpdir,uchar disk_batches)

{
  uint8_t *puVar1;
  byte bVar2;
  size_t sVar3;
  KMerNodeFreq_s *pKVar4;
  pointer pcVar5;
  undefined8 uVar6;
  int iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ostream *poVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  long lVar10;
  KMerNodeFreq_s *pKVar11;
  KmerList *__tmp;
  int i;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  size_t new_size;
  shared_ptr<KmerList> sVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream kff;
  uint64_t hist [256];
  long *local_a98 [2];
  long local_a88 [2];
  string local_a78;
  string local_a58;
  KmerList *local_a38;
  undefined8 local_a30 [30];
  ios_base local_940 [264];
  long local_838 [257];
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00255c98;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = this_00;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = this_00 + 1;
  poVar8 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"creating kmers from reads...",0x1c);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (disk_batches < 2) {
    memset(local_838,0,0x800);
    kmerCountOMP((BatchKmersCounter *)&local_a38,K,reads,0,
                 ((long)(reads->read_to_fileRecord).
                        super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(reads->read_to_fileRecord).
                        super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) - 1,0);
    *(KmerList **)this = local_a38;
    *(undefined8 *)(this + 8) = local_a30[0];
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    sVar3 = local_a38->size;
    if (sVar3 == 0) {
      new_size = 0;
    }
    else {
      pKVar4 = local_a38->kmers;
      lVar10 = 0;
      new_size = 0;
      pKVar11 = pKVar4;
      do {
        bVar2 = (&pKVar4->count)[lVar10];
        local_838[bVar2] = local_838[bVar2] + 1;
        if (minCount <= bVar2) {
          puVar1 = &pKVar4->count + lVar10;
          pKVar11->count = *puVar1;
          uVar6 = *(undefined8 *)(puVar1 + -8);
          *(long *)&pKVar11->kdata = (long)((KMerNodeFreq_s *)(puVar1 + -0x10))->kdata;
          *(undefined8 *)((long)&pKVar11->kdata + 8) = uVar6;
          pKVar11 = pKVar11 + 1;
          new_size = new_size + 1;
        }
        lVar10 = lVar10 + 0x11;
      } while (sVar3 * 0x11 != lVar10);
    }
    poVar8 = sdglib::OutputLog(INFO,true);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)K);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-mers with Freq >= ",0x13);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    KmerList::resize(local_a38,new_size);
    pcVar5 = (workdir->_M_dataplus)._M_p;
    local_a98[0] = local_a88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a98,pcVar5,pcVar5 + workdir->_M_string_length);
    std::__cxx11::string::append((char *)local_a98);
    std::ofstream::ofstream(&local_a38,(string *)local_a98,_S_out);
    if (local_a98[0] != local_a88) {
      operator_delete(local_a98[0],local_a88[0] + 1);
    }
    lVar10 = 1;
    do {
      poVar8 = (ostream *)std::ostream::operator<<(&local_a38,(int)lVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x100);
    std::ofstream::close();
    local_a38 = _VTT;
    *(undefined8 *)((long)local_a30 + (_VTT[-2].size - 8)) = _setbuf;
    std::filebuf::~filebuf((filebuf *)local_a30);
    std::ios_base::~ios_base(local_940);
    _Var9._M_pi = extraout_RDX_02;
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)tmpdir);
    if (iVar7 == 0) {
      std::__cxx11::string::_M_assign((string *)tmpdir);
    }
    local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
    pcVar5 = (tmpdir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a78,pcVar5,pcVar5 + tmpdir->_M_string_length);
    pcVar5 = (workdir->_M_dataplus)._M_p;
    local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a58,pcVar5,pcVar5 + workdir->_M_string_length);
    kmerCountOMPDiskBased
              ((BatchKmersCounter *)local_838,K,reads,minCount,&local_a78,&local_a58,disk_batches);
    *(long *)this = local_838[0];
    *(long *)(this + 8) = local_838[1];
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var9._M_pi = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
      operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
      _Var9._M_pi = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
      operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
      _Var9._M_pi = extraout_RDX_01;
    }
  }
  sVar12.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var9._M_pi;
  sVar12.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<KmerList>)sVar12.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<KmerList>
BatchKmersCounter::buildKMerCount(uint8_t K, LongReadsDatastore const &reads, unsigned minCount,
                                  std::string workdir, std::string tmpdir, unsigned char disk_batches) {
    std::shared_ptr<KmerList> spectrum=std::make_shared<KmerList>();
    sdglib::OutputLog() << "creating kmers from reads..." << std::endl;
    if (1 >= disk_batches) {
        uint64_t hist[256]={0};
        uint64_t used=0;
        spectrum=kmerCountOMP(K, reads, 0, reads.size(), 0);
        auto witr=spectrum->kmers;
        auto send=spectrum->kmers+spectrum->size;
        for (auto itr=spectrum->kmers;itr!=send;++itr){
            ++hist[itr->count];
            if (itr->count>=minCount) {
                (*witr)=(*itr);
                ++witr;
                ++used;
            }

        }
        sdglib::OutputLog() << used << "/" << spectrum->size << " " << int(K)<<"-mers with Freq >= " << minCount << std::endl;
        spectrum->resize(used);
        std::ofstream kff(workdir + "/small_K.freqs");
        for (auto i = 1; i < 256; i++) kff << i << ", " << hist[i] << std::endl;
        kff.close();
        //todo: filter kmers to minCount
    } else {
        if ("" == tmpdir) tmpdir = workdir;
        spectrum=kmerCountOMPDiskBased(K, reads, minCount, tmpdir, workdir, disk_batches);
    }

    return spectrum;
}